

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O0

bool __thiscall
vkt::texture::SampleVerifier::verifySampleReport
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,string *report)

{
  byte bVar1;
  string local_1d8 [55];
  byte local_1a1;
  ostringstream local_1a0 [7];
  bool isValid;
  ostringstream reportStream;
  string *report_local;
  Vec4 *result_local;
  SampleArguments *args_local;
  SampleVerifier *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1a1 = verifySampleImpl(this,args,result,(ostream *)local_1a0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)report,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  bVar1 = local_1a1;
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return (bool)(bVar1 & 1);
}

Assistant:

bool SampleVerifier::verifySampleReport (const SampleArguments&	args,
										 const Vec4&			result,
										 std::string&			report) const
{
	std::ostringstream reportStream;

	const bool isValid = verifySampleImpl(args, result, reportStream);

	report = reportStream.str();

    return isValid;
}